

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

void __thiscall CConsole::Print(CConsole *this,int Level,char *pFrom,char *pStr,bool Highlighted)

{
  long lVar1;
  long lVar2;
  void **ppvVar3;
  long in_FS_OFFSET;
  char aBuf [1024];
  char aTimeBuf [80];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_timestamp_format(aTimeBuf,0x50,"%H:%M:%S");
  str_format(aBuf,0x400,"[%s][%s]: %s",aTimeBuf,pFrom,pStr);
  dbg_msg(pFrom,"%s",pStr);
  ppvVar3 = &this->m_aPrintCB[0].m_pPrintCallbackUserdata;
  for (lVar2 = 0; lVar2 < this->m_NumPrintCB; lVar2 = lVar2 + 1) {
    if ((Level <= ((anon_struct_24_3_da75e937 *)(ppvVar3 + -2))->m_OutputLevel) &&
       ((FPrintCallback)ppvVar3[-1] != (FPrintCallback)0x0)) {
      (*(code *)ppvVar3[-1])(aBuf,*ppvVar3,Highlighted);
    }
    ppvVar3 = ppvVar3 + 3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::Print(int Level, const char *pFrom, const char *pStr, bool Highlighted)
{
	char aTimeBuf[80];
	str_timestamp_format(aTimeBuf, sizeof(aTimeBuf), FORMAT_TIME);

	char aBuf[1024];
	str_format(aBuf, sizeof(aBuf), "[%s][%s]: %s", aTimeBuf, pFrom, pStr);
	dbg_msg(pFrom ,"%s", pStr);
	for(int i = 0; i < m_NumPrintCB; ++i)
	{
		if(Level <= m_aPrintCB[i].m_OutputLevel && m_aPrintCB[i].m_pfnPrintCallback)
		{
			m_aPrintCB[i].m_pfnPrintCallback(aBuf, m_aPrintCB[i].m_pPrintCallbackUserdata, Highlighted);
		}
	}
}